

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-quants.c
# Opt level: O0

void ggml_vec_dot_q5_0_q8_0(int n,float *s,size_t bs,void *vx,size_t bx,void *vy,size_t by,int nrc)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m256 x_00;
  __m256i y_00;
  __m256i x_01;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  long lVar8;
  byte bVar9;
  long in_RCX;
  float *in_RSI;
  int in_EDI;
  long in_R9;
  undefined1 auVar10 [32];
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int sumi;
  int32_t x1;
  int32_t x0;
  uint8_t xh_1;
  uint8_t xh_0;
  int j;
  int sumi1;
  int sumi0;
  uint32_t qh;
  __m256 q;
  __m256i qy;
  __m256i bxhi;
  __m256i qx;
  __m256 d;
  __m256 acc;
  block_q8_0 *y;
  block_q5_0 *x;
  float sumf;
  int ib;
  int nb;
  int qk;
  float in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  undefined4 in_stack_fffffffffffffce8;
  undefined2 in_stack_fffffffffffffcec;
  undefined1 in_stack_fffffffffffffcee;
  undefined1 in_stack_fffffffffffffcef;
  undefined4 in_stack_fffffffffffffcf0;
  int iVar18;
  float in_stack_fffffffffffffcf4;
  int iVar19;
  undefined4 in_stack_fffffffffffffcf8;
  int iVar20;
  undefined4 in_stack_fffffffffffffcfc;
  undefined8 in_stack_fffffffffffffd00;
  uint8_t *in_stack_fffffffffffffd08;
  longlong in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd18;
  uint8_t *in_stack_fffffffffffffd30;
  undefined1 local_2c0 [16];
  undefined1 local_2a0 [16];
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_260 [16];
  undefined4 local_220;
  undefined4 local_21c;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  if (in_EDI < 0) {
    in_EDI = in_EDI + 0x1f;
  }
  local_260 = ZEXT816(0);
  for (local_21c = 0; local_21c < in_EDI >> 5; local_21c = local_21c + 1) {
    fVar11 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_RCX + (long)local_21c * 0x16));
    fVar12 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_R9 + (long)local_21c * 0x22));
    in_stack_fffffffffffffcd8 = fVar11 * fVar12;
    auVar13 = vinsertps_avx(ZEXT416((uint)in_stack_fffffffffffffcd8),
                            ZEXT416((uint)in_stack_fffffffffffffcd8),0x10);
    auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)in_stack_fffffffffffffcd8),0x20);
    auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)in_stack_fffffffffffffcd8),0x30);
    auVar2 = vinsertps_avx(ZEXT416((uint)in_stack_fffffffffffffcd8),
                           ZEXT416((uint)in_stack_fffffffffffffcd8),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)in_stack_fffffffffffffcd8),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)in_stack_fffffffffffffcd8),0x30);
    local_c0 = auVar13._0_8_;
    uStack_b8 = auVar13._8_8_;
    uStack_b0 = auVar2._0_8_;
    uStack_a8 = auVar2._8_8_;
    uVar14 = uStack_b0;
    uVar16 = uStack_a8;
    bytes_from_nibbles_32(in_stack_fffffffffffffd08);
    local_2a0._8_8_ = uStack_b8;
    local_2a0._0_8_ = local_c0;
    uVar15 = uVar14;
    uVar17 = uVar16;
    bytes_from_bits_32(in_stack_fffffffffffffd30);
    local_2c0._8_8_ = uStack_b8;
    local_2c0._0_8_ = local_c0;
    in_stack_fffffffffffffcdc = CONCAT13(0xf0,(int3)in_stack_fffffffffffffcdc);
    auVar2 = vpinsrb_avx(ZEXT116(0xf0),0xf0,1);
    auVar2 = vpinsrb_avx(auVar2,0xf0,2);
    auVar2 = vpinsrb_avx(auVar2,0xf0,3);
    auVar2 = vpinsrb_avx(auVar2,0xf0,4);
    auVar2 = vpinsrb_avx(auVar2,0xf0,5);
    auVar2 = vpinsrb_avx(auVar2,0xf0,6);
    auVar2 = vpinsrb_avx(auVar2,0xf0,7);
    auVar2 = vpinsrb_avx(auVar2,0xf0,8);
    auVar2 = vpinsrb_avx(auVar2,0xf0,9);
    auVar2 = vpinsrb_avx(auVar2,0xf0,10);
    auVar2 = vpinsrb_avx(auVar2,0xf0,0xb);
    auVar2 = vpinsrb_avx(auVar2,0xf0,0xc);
    auVar2 = vpinsrb_avx(auVar2,0xf0,0xd);
    auVar2 = vpinsrb_avx(auVar2,0xf0,0xe);
    auVar2 = vpinsrb_avx(auVar2,0xf0,0xf);
    auVar3 = vpinsrb_avx(ZEXT116(0xf0),0xf0,1);
    auVar3 = vpinsrb_avx(auVar3,0xf0,2);
    auVar3 = vpinsrb_avx(auVar3,0xf0,3);
    auVar3 = vpinsrb_avx(auVar3,0xf0,4);
    auVar3 = vpinsrb_avx(auVar3,0xf0,5);
    auVar3 = vpinsrb_avx(auVar3,0xf0,6);
    auVar3 = vpinsrb_avx(auVar3,0xf0,7);
    auVar3 = vpinsrb_avx(auVar3,0xf0,8);
    auVar3 = vpinsrb_avx(auVar3,0xf0,9);
    auVar3 = vpinsrb_avx(auVar3,0xf0,10);
    auVar3 = vpinsrb_avx(auVar3,0xf0,0xb);
    auVar3 = vpinsrb_avx(auVar3,0xf0,0xc);
    auVar3 = vpinsrb_avx(auVar3,0xf0,0xd);
    auVar3 = vpinsrb_avx(auVar3,0xf0,0xe);
    auVar3 = vpinsrb_avx(auVar3,0xf0,0xf);
    uStack_70 = auVar3._0_8_;
    uStack_68 = auVar3._8_8_;
    auVar6._16_8_ = uVar15;
    auVar6._0_16_ = local_2c0;
    auVar6._24_8_ = uVar17;
    auVar10 = vpternlogq_avx512vl(auVar6,auVar6,auVar6,0xf);
    auVar5._16_8_ = uStack_70;
    auVar5._0_16_ = auVar2;
    auVar5._24_8_ = uStack_68;
    auVar10 = vpand_avx2(auVar10,auVar5);
    auVar7._16_8_ = uVar14;
    auVar7._0_16_ = local_2a0;
    auVar7._24_8_ = uVar16;
    auVar10 = vpor_avx2(auVar7,auVar10);
    lVar8 = in_R9 + (long)local_21c * 0x22;
    in_stack_fffffffffffffd30 = *(uint8_t **)(lVar8 + 0x12);
    local_2a0._0_8_ = auVar10._0_8_;
    local_2a0._8_8_ = auVar10._8_8_;
    uStack_290 = auVar10._16_8_;
    uStack_288 = auVar10._24_8_;
    x_01[1] = *(undefined8 *)(lVar8 + 2);
    x_01[0] = in_stack_fffffffffffffd18;
    x_01[2] = *(undefined8 *)(lVar8 + 10);
    x_01[3] = (longlong)in_stack_fffffffffffffd30;
    y_00[0]._4_4_ = in_stack_fffffffffffffcfc;
    y_00[0]._0_4_ = in_stack_fffffffffffffcf8;
    y_00[1] = in_stack_fffffffffffffd00;
    y_00[2] = (longlong)in_stack_fffffffffffffd08;
    y_00[3] = in_stack_fffffffffffffd10;
    mul_sum_i8_pairs_float(x_01,y_00);
    auVar4._16_8_ = uStack_b0;
    auVar4._0_16_ = auVar13;
    auVar4._24_8_ = uStack_a8;
    auVar10._8_8_ = local_2a0._8_8_;
    auVar10._0_8_ = local_2a0._0_8_;
    auVar10._16_8_ = uStack_290;
    auVar10._24_8_ = uStack_288;
    local_260 = vfmadd213ps_fma(auVar10,auVar4,ZEXT1632(local_260));
    in_stack_fffffffffffffd00 = local_2a0._0_8_;
    in_stack_fffffffffffffd08 = (uint8_t *)local_2a0._8_8_;
    in_stack_fffffffffffffd10 = uStack_290;
    in_stack_fffffffffffffd18 = uStack_288;
  }
  x_00[1] = (float)in_stack_fffffffffffffcdc;
  x_00[0] = in_stack_fffffffffffffcd8;
  x_00[2] = (float)in_stack_fffffffffffffce0;
  x_00[3] = (float)in_stack_fffffffffffffce4;
  x_00[4] = (float)in_stack_fffffffffffffce8;
  x_00[5]._0_2_ = in_stack_fffffffffffffcec;
  x_00[5]._2_1_ = in_stack_fffffffffffffcee;
  x_00[5]._3_1_ = in_stack_fffffffffffffcef;
  x_00[6] = (float)in_stack_fffffffffffffcf0;
  x_00[7] = in_stack_fffffffffffffcf4;
  local_220 = hsum_float_8(x_00);
  for (; local_21c < in_EDI >> 5; local_21c = local_21c + 1) {
    uVar1 = *(uint *)(in_RCX + (long)local_21c * 0x16 + 2);
    iVar20 = 0;
    iVar19 = 0;
    for (iVar18 = 0; iVar18 < 0x10; iVar18 = iVar18 + 1) {
      bVar9 = (byte)iVar18;
      iVar20 = (int)(char)((*(byte *)(in_RCX + (long)local_21c * 0x16 + 6 + (long)iVar18) & 0xf |
                           (byte)(((uVar1 & 1 << (bVar9 & 0x1f)) >> (bVar9 & 0x1f)) << 4)) - 0x10) *
               (int)*(char *)(in_R9 + (long)local_21c * 0x22 + 2 + (long)iVar18) + iVar20;
      iVar19 = (int)(char)(((byte)((int)(uint)*(byte *)(in_RCX + (long)local_21c * 0x16 + 6 +
                                                       (long)iVar18) >> 4) |
                           (byte)((uVar1 & 1 << (bVar9 + 0x10 & 0x1f)) >> (bVar9 + 0xc & 0x1f))) -
                          0x10) *
               (int)*(char *)(in_R9 + (long)local_21c * 0x22 + 2 + (long)(iVar18 + 0x10)) + iVar19;
    }
    iVar20 = iVar20 + iVar19;
    fVar11 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_RCX + (long)local_21c * 0x16));
    fVar12 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_R9 + (long)local_21c * 0x22));
    auVar13._0_4_ = (float)iVar20;
    auVar13._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar13 = vfmadd213ss_fma(auVar13,ZEXT416((uint)(fVar11 * fVar12)),ZEXT416((uint)local_220));
    local_220 = auVar13._0_4_;
  }
  *in_RSI = local_220;
  return;
}

Assistant:

void ggml_vec_dot_q5_0_q8_0(int n, float * GGML_RESTRICT s, size_t bs, const void * GGML_RESTRICT vx, size_t bx, const void * GGML_RESTRICT vy, size_t by, int nrc) {
    const int qk = QK8_0;
    const int nb = n / qk;

    int ib = 0;
    float sumf = 0;

    assert(n % qk == 0);
    assert(qk == QK5_0);
    assert(nrc == 1);
    UNUSED(nrc);
    UNUSED(bx);
    UNUSED(by);
    UNUSED(bs);

    const block_q5_0 * GGML_RESTRICT x = vx;
    const block_q8_0 * GGML_RESTRICT y = vy;

#if defined(__ARM_NEON)
    float32x4_t sumv0 = vdupq_n_f32(0.0f);
    float32x4_t sumv1 = vdupq_n_f32(0.0f);

    uint32_t qh0;
    uint32_t qh1;

    uint64_t tmp0[4];
    uint64_t tmp1[4];

    for (; ib + 1 < nb; ib += 2) {
        const block_q5_0 * GGML_RESTRICT x0 = &x[ib];
        const block_q5_0 * GGML_RESTRICT x1 = &x[ib + 1];
        const block_q8_0 * GGML_RESTRICT y0 = &y[ib];
        const block_q8_0 * GGML_RESTRICT y1 = &y[ib + 1];

        const uint8x16_t m4b = vdupq_n_u8(0x0F);

        // extract the 5th bit via lookup table ((!b) << 4)
        memcpy(&qh0, x0->qh, sizeof(qh0));
        memcpy(&qh1, x1->qh, sizeof(qh1));

        tmp0[0] = table_b2b_1[(qh0 >>  0) & 0xFF];
        tmp0[1] = table_b2b_1[(qh0 >>  8) & 0xFF];
        tmp0[2] = table_b2b_1[(qh0 >> 16) & 0xFF];
        tmp0[3] = table_b2b_1[(qh0 >> 24)       ];

        tmp1[0] = table_b2b_1[(qh1 >>  0) & 0xFF];
        tmp1[1] = table_b2b_1[(qh1 >>  8) & 0xFF];
        tmp1[2] = table_b2b_1[(qh1 >> 16) & 0xFF];
        tmp1[3] = table_b2b_1[(qh1 >> 24)       ];

        const int8x16_t qhl0 = vld1q_s8((const int8_t *)(tmp0 + 0));
        const int8x16_t qhh0 = vld1q_s8((const int8_t *)(tmp0 + 2));
        const int8x16_t qhl1 = vld1q_s8((const int8_t *)(tmp1 + 0));
        const int8x16_t qhh1 = vld1q_s8((const int8_t *)(tmp1 + 2));

        const uint8x16_t v0_0 = vld1q_u8(x0->qs);
        const uint8x16_t v0_1 = vld1q_u8(x1->qs);

        // 4-bit -> 8-bit
        int8x16_t v0_0l = vreinterpretq_s8_u8(vandq_u8  (v0_0, m4b));
        int8x16_t v0_0h = vreinterpretq_s8_u8(vshrq_n_u8(v0_0, 4));
        int8x16_t v0_1l = vreinterpretq_s8_u8(vandq_u8  (v0_1, m4b));
        int8x16_t v0_1h = vreinterpretq_s8_u8(vshrq_n_u8(v0_1, 4));

        // add high bit and sub 16 (equivalent to sub 0x10 when bit is zero)
        const int8x16_t v0_0lf = vsubq_s8(v0_0l, qhl0);
        const int8x16_t v0_0hf = vsubq_s8(v0_0h, qhh0);
        const int8x16_t v0_1lf = vsubq_s8(v0_1l, qhl1);
        const int8x16_t v0_1hf = vsubq_s8(v0_1h, qhh1);

        // load y
        const int8x16_t v1_0l = vld1q_s8(y0->qs);
        const int8x16_t v1_0h = vld1q_s8(y0->qs + 16);
        const int8x16_t v1_1l = vld1q_s8(y1->qs);
        const int8x16_t v1_1h = vld1q_s8(y1->qs + 16);

        sumv0 = vmlaq_n_f32(sumv0, vcvtq_f32_s32(vaddq_s32(
                        ggml_vdotq_s32(vdupq_n_s32(0), v0_0lf, v1_0l),
                        ggml_vdotq_s32(vdupq_n_s32(0), v0_0hf, v1_0h))), GGML_FP16_TO_FP32(x0->d)*GGML_FP16_TO_FP32(y0->d));
        sumv1 = vmlaq_n_f32(sumv1, vcvtq_f32_s32(vaddq_s32(
                        ggml_vdotq_s32(vdupq_n_s32(0), v0_1lf, v1_1l),
                        ggml_vdotq_s32(vdupq_n_s32(0), v0_1hf, v1_1h))), GGML_FP16_TO_FP32(x1->d)*GGML_FP16_TO_FP32(y1->d));
    }

    sumf = vaddvq_f32(sumv0) + vaddvq_f32(sumv1);
#elif defined __wasm_simd128__
    v128_t sumv = wasm_f32x4_splat(0.0f);

    uint32_t qh_;
    uint64_t tmp[4];

    // TODO: check if unrolling this is better
    for (; ib < nb; ++ib) {
        const block_q5_0 * GGML_RESTRICT x0 = &x[ib];
        const block_q8_0 * GGML_RESTRICT y0 = &y[ib];

        const v128_t m4b  = wasm_i8x16_splat(0x0F);

        // extract the 5th bit
        memcpy(&qh_, x0->qh, sizeof(qh_));

        tmp[0] = table_b2b_1[(qh_ >>  0) & 0xFF];
        tmp[1] = table_b2b_1[(qh_ >>  8) & 0xFF];
        tmp[2] = table_b2b_1[(qh_ >> 16) & 0xFF];
        tmp[3] = table_b2b_1[(qh_ >> 24)       ];

        const v128_t qhl = wasm_v128_load(tmp + 0);
        const v128_t qhh = wasm_v128_load(tmp + 2);

        const v128_t v0 = wasm_v128_load(x0->qs);

        // 4-bit -> 8-bit
        const v128_t v0l = wasm_v128_and (v0, m4b);
        const v128_t v0h = wasm_u8x16_shr(v0, 4);

        // add high bit and sub 16 (equivalent to sub 0x10 when bit is zero)
        const v128_t v0lf = wasm_i8x16_sub(v0l, qhl);
        const v128_t v0hf = wasm_i8x16_sub(v0h, qhh);

        // load y
        const v128_t v1l = wasm_v128_load(y0->qs);
        const v128_t v1h = wasm_v128_load(y0->qs + 16);

        // int8x16 -> int16x8
        const v128_t v0lfl = wasm_i16x8_extend_low_i8x16 (v0lf);
        const v128_t v0lfh = wasm_i16x8_extend_high_i8x16(v0lf);
        const v128_t v0hfl = wasm_i16x8_extend_low_i8x16 (v0hf);
        const v128_t v0hfh = wasm_i16x8_extend_high_i8x16(v0hf);

        const v128_t v1ll = wasm_i16x8_extend_low_i8x16 (v1l);
        const v128_t v1lh = wasm_i16x8_extend_high_i8x16(v1l);
        const v128_t v1hl = wasm_i16x8_extend_low_i8x16 (v1h);
        const v128_t v1hh = wasm_i16x8_extend_high_i8x16(v1h);

        // dot product
        sumv = wasm_f32x4_add(sumv, wasm_f32x4_mul(wasm_f32x4_convert_i32x4(
                        wasm_i32x4_add(
                            wasm_i32x4_add(wasm_i32x4_dot_i16x8(v0lfl, v1ll),
                                           wasm_i32x4_dot_i16x8(v0lfh, v1lh)),
                            wasm_i32x4_add(wasm_i32x4_dot_i16x8(v0hfl, v1hl),
                                           wasm_i32x4_dot_i16x8(v0hfh, v1hh)))),
                    wasm_f32x4_splat(GGML_FP16_TO_FP32(x0->d) * GGML_FP16_TO_FP32(y0->d))));
    }

    sumf = wasm_f32x4_extract_lane(sumv, 0) + wasm_f32x4_extract_lane(sumv, 1) +
           wasm_f32x4_extract_lane(sumv, 2) + wasm_f32x4_extract_lane(sumv, 3);
#elif defined(__AVX2__)
    // Initialize accumulator with zeros
    __m256 acc = _mm256_setzero_ps();

    // Main loop
    for (; ib < nb; ++ib) {
        /* Compute combined scale for the block */
        const __m256 d = _mm256_set1_ps(GGML_FP16_TO_FP32(x[ib].d) * GGML_FP16_TO_FP32(y[ib].d));

        __m256i qx = bytes_from_nibbles_32(x[ib].qs);
        __m256i bxhi = bytes_from_bits_32(x[ib].qh);
        bxhi = _mm256_andnot_si256(bxhi, _mm256_set1_epi8((char)0xF0));
        qx = _mm256_or_si256(qx, bxhi);

        __m256i qy = _mm256_loadu_si256((const __m256i *)y[ib].qs);

        const __m256 q = mul_sum_i8_pairs_float(qx, qy);

        /* Multiply q with scale and accumulate */
        acc = _mm256_fmadd_ps(d, q, acc);
    }

    sumf = hsum_float_8(acc);
#elif defined(__AVX__)
    // Initialize accumulator with zeros
    __m256 acc = _mm256_setzero_ps();
    __m128i mask = _mm_set1_epi8((char)0xF0);

    // Main loop
    for (; ib < nb; ++ib) {
        /* Compute combined scale for the block */
        const __m256 d = _mm256_set1_ps(GGML_FP16_TO_FP32(x[ib].d) * GGML_FP16_TO_FP32(y[ib].d));

        __m256i bx_0 = bytes_from_nibbles_32(x[ib].qs);
        const __m256i bxhi = bytes_from_bits_32(x[ib].qh);
        __m128i bxhil = _mm256_castsi256_si128(bxhi);
        __m128i bxhih = _mm256_extractf128_si256(bxhi, 1);
        bxhil = _mm_andnot_si128(bxhil, mask);
        bxhih = _mm_andnot_si128(bxhih, mask);
        __m128i bxl = _mm256_castsi256_si128(bx_0);
        __m128i bxh = _mm256_extractf128_si256(bx_0, 1);
        bxl = _mm_or_si128(bxl, bxhil);
        bxh = _mm_or_si128(bxh, bxhih);
        bx_0 = MM256_SET_M128I(bxh, bxl);

        const __m256i by_0 = _mm256_loadu_si256((const __m256i *)y[ib].qs);

        const __m256 q = mul_sum_i8_pairs_float(bx_0, by_0);

        /* Multiply q with scale and accumulate */
        acc = _mm256_add_ps(_mm256_mul_ps(d, q), acc);
    }

    sumf = hsum_float_8(acc);
#elif defined(__riscv_v_intrinsic)
    size_t vl;
    size_t vlenb = __riscv_vlenb();

    for (; ib < nb; ++ib) {
        vl = qk / 2;
        vuint8m1_t v0 = __riscv_vle8_v_u8m1(x[ib].qs, vl);
        vint8m1_t v0l = __riscv_vreinterpret_v_u8m1_i8m1(__riscv_vand_vx_u8m1(v0, 0x0F, vl));
        vint8m1_t v0h = __riscv_vreinterpret_v_u8m1_i8m1(__riscv_vsrl_vx_u8m1(v0, 4, vl));
        vint8m2_t v0c;
        if (vlenb == 16) {
            v0c = __riscv_vcreate_v_i8m1_i8m2(v0l, v0h);
        } else {
            v0l = __riscv_vslideup_vx_i8m1(v0l, v0h, 16, 32);
            v0c = __riscv_vlmul_ext_v_i8m1_i8m2(v0l);
        }

        vl = qk;
        vbool4_t qh = __riscv_vlm_v_b4(x[ib].qh, vl);
        qh = __riscv_vmnand_mm_b4(qh, qh, vl);
        vint8m2_t v0f = __riscv_vsub_vx_i8m2_mu(qh, v0c, v0c, 0x10, vl);
        vint8m2_t v1 = __riscv_vle8_v_i8m2(y[ib].qs, vl);
        vint16m4_t mul = __riscv_vwmul_vv_i16m4(v0f, v1, vl);
        vint32m1_t zero = __riscv_vmv_v_x_i32m1(0, vl);
        vint32m1_t sum = __riscv_vwredsum_vs_i16m4_i32m1(mul, zero, vl);
        int32_t sumi = __riscv_vmv_x_s_i32m1_i32(sum);

        sumf += (GGML_FP16_TO_FP32(x[ib].d) * GGML_FP16_TO_FP32(y[ib].d)) * sumi;
    }

#elif defined(__POWER9_VECTOR__)
    const vector signed char lowMask = vec_splats((signed char)0xF);
    const vector unsigned char v4 = vec_splats((unsigned char)4);

    vector float vsumf0 = vec_splats(0.0f);

#pragma GCC unroll 4
    for (; ib < nb; ++ib) {
        __builtin_prefetch(x[ib].qs, 0, 1);
        __builtin_prefetch(y[ib].qs, 0, 1);

        vector float vxd = vec_splats(GGML_FP16_TO_FP32(x[ib].d));
        vector float vyd = vec_splats(GGML_FP16_TO_FP32(y[ib].d));
        vector float vd = vec_mul(vxd, vyd);

        vector signed long long aux64x2_0 = {(uint64_t)(table_b2b_1[x[ib].qh[0]]), (uint64_t)(table_b2b_1[x[ib].qh[1]])};
        vector signed long long aux64x2_1 = {(uint64_t)(table_b2b_1[x[ib].qh[2]]), (uint64_t)(table_b2b_1[x[ib].qh[3]])};

        vector signed char qh0 = (vector signed char)aux64x2_0;
        vector signed char qh1 = (vector signed char)aux64x2_1;

        vector signed char qxs = (vector signed char)vec_xl( 0, x[ib].qs);

        vector signed char q5x0 = vec_sub(vec_and (qxs, lowMask), qh0);
        vector signed char q5x1 = vec_sub(vec_sr(qxs, v4), qh1);

        vector signed char q8y0 = vec_xl(  0, y[ib].qs);
        vector signed char q8y1 = vec_xl( 16, y[ib].qs);

        vector signed short qv0 = vec_add(vec_mule(q5x0, q8y0), vec_mulo(q5x0, q8y0));
        vector signed short qv1 = vec_add(vec_mule(q5x1, q8y1), vec_mulo(q5x1, q8y1));

        qv0 = vec_add(qv0, qv1);

        vector signed int vsumi0 = vec_add(vec_unpackh(qv0), vec_unpackl(qv0));

        vsumf0 = vec_madd(vec_ctf(vsumi0, 0), vd, vsumf0);
    }

    vsumf0 = vec_add(vsumf0, vec_sld(vsumf0, vsumf0, 4));
    vsumf0 = vec_add(vsumf0, vec_sld(vsumf0, vsumf0, 8));

    sumf = vec_extract(vsumf0, 0);

#elif defined(__loongarch_asx)
    // Initialize accumulator with zeros
    __m256 acc = (__m256)__lasx_xvldi(0);

    // Main loop
    for (; ib < nb; ++ib) {
        /* Compute combined scale for the block */
        const __m256 d = __lasx_xvreplfr2vr_s(GGML_FP16_TO_FP32(x[ib].d) * GGML_FP16_TO_FP32(y[ib].d)); //FIXME

        __m256i qx = bytes_from_nibbles_32(x[ib].qs);
        __m256i bxhi = bytes_from_bits_32(x[ib].qh);
        bxhi = __lasx_xvandn_v(bxhi, __lasx_xvreplgr2vr_b((char)0xF0));
        qx = __lasx_xvor_v(qx, bxhi);

        __m256i qy = __lasx_xvld((const __m256i *)y[ib].qs, 0);

        const __m256 q = mul_sum_i8_pairs_float(qx, qy);

        /* Multiply q with scale and accumulate */
        acc = __lasx_xvfmadd_s(d, q, acc);
    }

    sumf = hsum_float_8(acc);
#endif
    for (; ib < nb; ++ib) {
        uint32_t qh;
        memcpy(&qh, x[ib].qh, sizeof(qh));

        int sumi0 = 0;
        int sumi1 = 0;

        for (int j = 0; j < qk/2; ++j) {
            const uint8_t xh_0 = ((qh & (1u << (j + 0 ))) >> (j + 0 )) << 4;
            const uint8_t xh_1 = ((qh & (1u << (j + 16))) >> (j + 12));

            const int32_t x0 = (int8_t)(((x[ib].qs[j] & 0x0F) | xh_0) - 16);
            const int32_t x1 = (int8_t)(((x[ib].qs[j] >>   4) | xh_1) - 16);

            sumi0 += (x0 * y[ib].qs[j]);
            sumi1 += (x1 * y[ib].qs[j + qk/2]);
        }

        int sumi = sumi0 + sumi1;
        sumf += (GGML_FP16_TO_FP32(x[ib].d)*GGML_FP16_TO_FP32(y[ib].d)) * sumi;
    }

    *s = sumf;
}